

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_rule.h
# Opt level: O2

void __thiscall
re2c::RuleOp::RuleOp(RuleOp *this,Loc *l,RegExp *r1,RegExp *r2,rule_rank_t r,Code *c,string *cond)

{
  allocator<char> local_39;
  Loc *local_38;
  
  RegExp::RegExp(&this->super_RegExp);
  (this->super_RegExp)._vptr_RegExp = (_func_int **)&PTR__RuleOp_00165ce8;
  local_38 = &this->loc;
  Loc::Loc(local_38,l);
  this->exp = r1;
  this->ctx = r2;
  (this->rank).value = r.value;
  this->code = c;
  if (cond == (string *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&this->newcond,"",&local_39);
  }
  else {
    std::__cxx11::string::string((string *)&this->newcond,(string *)cond);
  }
  return;
}

Assistant:

inline RuleOp
		( const Loc & l
		, RegExp * r1
		, RegExp * r2
		, rule_rank_t r
		, const Code * c
		, const std::string * cond
		)
		: loc (l)
		, exp (r1)
		, ctx (r2)
		, rank (r)
		, code (c)
		, newcond (cond ? *cond : "")
	{}